

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
          (dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this,
          size_type count_in,const_reference value_in,allocator_type *alloc_in)

{
  pointer pcVar1;
  iterator pvVar2;
  char *local_38;
  iterator it;
  allocator_type *paStack_28;
  allocator_type my_alloc;
  allocator_type *alloc_in_local;
  const_reference value_in_local;
  size_type count_in_local;
  dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this_local;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_003720e8;
  this->elem_count = count_in;
  this->elems = (pointer)0x0;
  if (this->elem_count != 0) {
    paStack_28 = alloc_in;
    std::allocator<char>::allocator((allocator *)((long)&it + 7));
    pcVar1 = std::allocator_traits<std::allocator<char>_>::allocate
                       ((allocator_type *)((long)&it + 7),(ulong)this->elem_count);
    this->elems = pcVar1;
    for (local_38 = begin(this); pvVar2 = end(this), local_38 != pvVar2; local_38 = local_38 + 1) {
      std::allocator_traits<std::allocator<char>>::construct<char,char_const&>
                ((allocator_type *)((long)&it + 7),local_38,value_in);
    }
  }
  return;
}

Assistant:

explicit constexpr dynamic_array(size_type count_in,
                                     const_reference value_in = value_type(),
                                     const allocator_type& alloc_in = allocator_type())
      : elem_count(count_in)
    {
      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        allocator_type my_alloc(alloc_in);

        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);

        iterator it = begin();

        while(it != end())
        {
          std::allocator_traits<allocator_type>::construct(my_alloc, it, value_in);

          ++it;
        }
      }
    }